

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O0

lookahead_entry * pop(lookahead_ctx *ctx,int *idx)

{
  int iVar1;
  lookahead_entry *plVar2;
  lookahead_entry *buf;
  int index;
  int *idx_local;
  lookahead_ctx *ctx_local;
  
  iVar1 = *idx;
  plVar2 = ctx->buf;
  index = iVar1 + 1;
  if (ctx->max_sz <= index) {
    index = index - ctx->max_sz;
  }
  *idx = index;
  return plVar2 + iVar1;
}

Assistant:

static struct lookahead_entry *pop(struct lookahead_ctx *ctx, int *idx) {
  int index = *idx;
  struct lookahead_entry *buf = ctx->buf + index;

  assert(index < ctx->max_sz);
  if (++index >= ctx->max_sz) index -= ctx->max_sz;
  *idx = index;
  return buf;
}